

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_sig(png_structrp png_ptr)

{
  byte *pbVar1;
  png_byte png_signature [8];
  png_byte local_10 [8];
  
  local_10[0] = 0x89;
  local_10[1] = 'P';
  local_10[2] = 'N';
  local_10[3] = 'G';
  local_10[4] = '\r';
  local_10[5] = '\n';
  local_10[6] = '\x1a';
  local_10[7] = '\n';
  png_ptr->io_state = 0x12;
  png_write_data(png_ptr,local_10 + png_ptr->sig_bytes,8 - (ulong)png_ptr->sig_bytes);
  if (png_ptr->sig_bytes < 3) {
    pbVar1 = (byte *)((long)&png_ptr->mode + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  return;
}

Assistant:

void PNGAPI
png_write_sig(png_structrp png_ptr)
{
   png_byte png_signature[8] = {137, 80, 78, 71, 13, 10, 26, 10};

#ifdef PNG_IO_STATE_SUPPORTED
   /* Inform the I/O callback that the signature is being written */
   png_ptr->io_state = PNG_IO_WRITING | PNG_IO_SIGNATURE;
#endif

   /* Write the rest of the 8 byte signature */
   png_write_data(png_ptr, &png_signature[png_ptr->sig_bytes],
       (size_t)(8 - png_ptr->sig_bytes));

   if (png_ptr->sig_bytes < 3)
      png_ptr->mode |= PNG_HAVE_PNG_SIGNATURE;
}